

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

ssize_t __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint *puVar1;
  TaskSet *this_00;
  ArrayPtr<const_capnp::word> array;
  word *pwVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  TransformPromiseNodeBase *this_01;
  ConnectionImpl *extraout_RAX;
  ConnectionImpl *pCVar5;
  ReaderOptions options;
  Array<capnp::word> local_a8;
  Own<kj::_::PromiseNode> local_88;
  undefined1 local_78 [16];
  ArrayDisposer *local_68;
  Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
  local_60;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  pCVar5 = this->connection;
  if ((pCVar5->networkException).ptr.isSet == false) {
    puVar1 = &pCVar5->network->sent;
    *puVar1 = *puVar1 + 1;
    messageToFlatArray(&local_a8,&(this->message).super_MessageBuilder);
    pAVar4 = (ArrayDisposer *)operator_new(0x138);
    sVar3 = local_a8.size_;
    pwVar2 = local_a8.ptr;
    array.size_ = local_a8.size_;
    array.ptr = local_a8.ptr;
    local_68 = local_a8.disposer;
    local_a8.ptr = (word *)0x0;
    local_a8.size_ = 0;
    *(undefined4 *)&pAVar4[2]._vptr_ArrayDisposer = 0;
    pAVar4->_vptr_ArrayDisposer = (_func_int **)&PTR_getBody_0065c670;
    pAVar4[1]._vptr_ArrayDisposer = (_func_int **)&PTR_disposeImpl_0065c698;
    pAVar4[3]._vptr_ArrayDisposer = (_func_int **)pwVar2;
    pAVar4[4]._vptr_ArrayDisposer = (_func_int **)sVar3;
    pAVar4[5]._vptr_ArrayDisposer = (_func_int **)local_a8.disposer;
    local_78._0_8_ = (word *)0x0;
    local_78._8_8_ = 0;
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    FlatArrayMessageReader::FlatArrayMessageReader
              ((FlatArrayMessageReader *)(pAVar4 + 6),array,options);
    local_60.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
          ::instance;
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_78);
    kj::Array<capnp::word>::~Array(&local_a8);
    pCVar5 = this->connection;
    this_00 = (pCVar5->tasks).ptr;
    local_78._8_8_ =
         &kj::_::
          HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
          ::instance;
    local_60.ptr = (IncomingRpcMessageImpl *)0x0;
    local_78._0_8_ = pCVar5;
    local_68 = pAVar4;
    kj::_::yield();
    this_01 = (TransformPromiseNodeBase *)operator_new(0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_50,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:280:13),_kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>_>
               ::operator()<>);
    (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065c730;
    this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pCVar5;
    this_01[1].dependency.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
          ::instance;
    this_01[1].dependency.ptr = (PromiseNode *)pAVar4;
    local_68 = (ArrayDisposer *)0x0;
    local_a8.ptr = (word *)&kj::_::
                            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>>,kj::_::PropagateException>>
                            ::instance;
    local_40.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>>,kj::_::PropagateException>>
          ::instance;
    local_a8.size_ = 0;
    local_88.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::OutgoingRpcMessageImpl::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>>,kj::_::PropagateException>>
          ::instance;
    local_40.ptr = (PromiseNode *)0x0;
    local_88.ptr = (PromiseNode *)this_01;
    kj::Own<kj::_::PromiseNode>::dispose(&local_40);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_a8);
    kj::Own<kj::_::PromiseNode>::dispose(&local_50);
    kj::TaskSet::add(this_00,(Promise<void> *)&local_88);
    kj::Own<kj::_::PromiseNode>::dispose(&local_88);
    kj::
    Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
    ::~Own((Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
            *)(local_78 + 8));
    kj::
    Own<capnp::_::(anonymous_namespace)::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl>
    ::~Own(&local_60);
    pCVar5 = extraout_RAX;
  }
  return (ssize_t)pCVar5;
}

Assistant:

void send() override {
        if (connection.networkException != nullptr) {
          return;
        }

        ++connection.network.sent;

        // Uncomment to get a debug dump.
//        kj::String msg = connection.network.network.dumper.dump(
//            message.getRoot<rpc::Message>(), connection.sender);
//        KJ_ DBG(msg);

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        auto connectionPtr = &connection;
        connection.tasks->add(kj::evalLater(kj::mvCapture(incomingMessage,
            [connectionPtr](kj::Own<IncomingRpcMessageImpl>&& message) {
          KJ_IF_MAYBE(p, connectionPtr->partner) {
            if (p->fulfillers.empty()) {
              p->messages.push(kj::mv(message));
            } else {
              ++p->network.received;
              p->fulfillers.front()->fulfill(
                  kj::Own<IncomingRpcMessage>(kj::mv(message)));
              p->fulfillers.pop();
            }
          }
        })));
      }